

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoneyTest.cpp
# Opt level: O2

void __thiscall OrderMoneyTest::OrderMoneyTest(OrderMoneyTest *this)

{
  allocator<char> local_1e1;
  int local_1e0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  shared_ptr<RealMoney> local_1d0;
  shared_ptr<RealMoney> local_1c0;
  char local_1b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  shared_ptr<OrderMoney> local_1a0;
  shared_ptr<MoneyText> local_190;
  shared_ptr<oout::NamedTest> local_180;
  int local_170 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  shared_ptr<RealMoney> local_160;
  shared_ptr<RealMoney> local_150;
  shared_ptr<RealMoney> local_140;
  shared_ptr<OrderMoney> local_130;
  shared_ptr<MoneyText> local_120;
  shared_ptr<oout::NamedTest> local_110;
  int local_100 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  shared_ptr<RealMoney> local_f0;
  shared_ptr<OrderMoney> local_e0;
  shared_ptr<MoneyText> local_d0;
  shared_ptr<oout::NamedTest> local_c0;
  int local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  shared_ptr<RealMoney> local_a0;
  shared_ptr<RealMoney> local_90;
  shared_ptr<OrderMoney> local_80;
  shared_ptr<MoneyText> local_70;
  shared_ptr<oout::NamedTest> local_60;
  char local_4c [4];
  char local_48 [4];
  undefined4 local_44;
  char local_40 [4];
  char local_3c [4];
  char local_38 [4];
  char local_34 [4];
  char local_30 [4];
  char local_2c [4];
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"OrderMoney tests",&local_1e1);
  local_2c[0] = '\x05';
  local_2c[1] = '\0';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_a0,&local_2c);
  local_30[0] = '\a';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>(local_b0,&local_30);
  std::make_shared<OrderMoney,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            (&local_90,&local_a0);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>(&local_80);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_70,(char (*) [7])&local_80);
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])&local_60,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is sum of all items");
  local_34[0] = '*';
  local_34[1] = '\0';
  local_34[2] = '\0';
  local_34[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>(local_100,&local_34);
  std::make_shared<OrderMoney,std::shared_ptr<RealMoney>>(&local_f0);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>(&local_e0);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_d0,(char (*) [7])&local_e0);
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])&local_c0,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is sum of one items");
  local_38[0] = '\x01';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_150,&local_38);
  local_3c[0] = '\x02';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_160,&local_3c);
  local_40[0] = '\x04';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>(local_170,&local_40);
  std::
  make_shared<OrderMoney,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            (&local_140,&local_150,&local_160);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>(&local_130);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[6]>
            (&local_120,(char (*) [6])&local_130);
  std::make_shared<oout::NamedTest,char_const(&)[33],std::shared_ptr<oout::EqualTest>>
            ((char (*) [33])&local_110,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is sum of three items");
  local_44 = 2;
  std::make_shared<Bank,char_const(&)[4],char_const(&)[4],int>
            ((char (*) [4])&local_1c0,(char (*) [4])"CHF",(int *)0x12101a);
  local_48[0] = '\x05';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_1d0,&local_48);
  local_4c[0] = '\n';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>(local_1e0,&local_4c);
  std::
  make_shared<OrderMoney,char_const(&)[4],std::shared_ptr<Bank>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            ((char (*) [4])local_1b0,(shared_ptr<Bank> *)0x12101a,&local_1c0,&local_1d0);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>(&local_1a0);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_190,(char (*) [7])&local_1a0);
  std::make_shared<oout::NamedTest,char_const(&)[40],std::shared_ptr<oout::EqualTest>>
            ((char (*) [40])&local_180,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is unify all money over Bank");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_28,&local_60,&local_c0,&local_110,&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_180.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_190.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_130.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_140.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_160.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_150.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<MoneyText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super___shared_ptr<OrderMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00129328;
  return;
}

Assistant:

OrderMoneyTest::OrderMoneyTest()
: dirty::Test(
	"OrderMoney tests",
	make_shared<NamedTest>(
		"OrderMoney is sum of all items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(7, "USD")
				)
			),
			"12 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of one items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(42, "USD")
				)
			),
			"42 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of three items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(1, "USD"),
					make_shared<RealMoney>(2, "USD"),
					make_shared<RealMoney>(4, "USD")
				)
			),
			"7 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is unify all money over Bank",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					"USD",
					make_shared<Bank>("CHF", "USD", 2),
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(10, "CHF")
				)
			),
			"10 USD"
		)
	)
)
{
}